

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

SizedPtr google::protobuf::internal::AllocateAtLeast(size_t size)

{
  code *pcVar1;
  SizedPtr SVar2;
  long lVar3;
  undefined1 auVar4 [16];
  size_t size_local;
  size_t local_10;
  
  lVar3 = __tls_get_addr(&PTR_008ac548);
  if (*(long *)(lVar3 + 0x28) == 0) {
    size_local = (size_t)operator_new(size);
    local_10 = size;
  }
  else {
    lVar3 = __tls_get_addr(&PTR_008ac548);
    pcVar1 = *(code **)(lVar3 + 0x28);
    lVar3 = __tls_get_addr(&PTR_008ac548);
    auVar4 = (*pcVar1)(size,*(undefined8 *)(lVar3 + 0x30));
    local_10 = auVar4._8_8_;
    size_local = auVar4._0_8_;
  }
  SVar2.n = local_10;
  SVar2.p = (void *)size_local;
  return SVar2;
}

Assistant:

inline SizedPtr AllocateAtLeast(size_t size) {
#if !defined(NDEBUG) && defined(ABSL_HAVE_THREAD_LOCAL) && \
    defined(__cpp_inline_variables)
  if (allocate_at_least_hook != nullptr) {
    return allocate_at_least_hook(size, allocate_at_least_hook_context);
  }
#endif  // !NDEBUG && ABSL_HAVE_THREAD_LOCAL && __cpp_inline_variables
  return {::operator new(size), size};
}